

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::MergingIterator::FindSmallest(MergingIterator *this)

{
  Comparator *pCVar1;
  bool bVar2;
  int iVar3;
  Slice local_48;
  Slice local_38;
  IteratorWrapper *local_28;
  IteratorWrapper *child;
  IteratorWrapper *pIStack_18;
  int i;
  IteratorWrapper *smallest;
  MergingIterator *this_local;
  
  pIStack_18 = (IteratorWrapper *)0x0;
  smallest = (IteratorWrapper *)this;
  for (child._4_4_ = 0; child._4_4_ < this->n_; child._4_4_ = child._4_4_ + 1) {
    local_28 = this->children_ + child._4_4_;
    bVar2 = IteratorWrapper::Valid(local_28);
    if (bVar2) {
      if (pIStack_18 == (IteratorWrapper *)0x0) {
        pIStack_18 = local_28;
      }
      else {
        pCVar1 = this->comparator_;
        local_38 = IteratorWrapper::key(local_28);
        local_48 = IteratorWrapper::key(pIStack_18);
        iVar3 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_38,&local_48);
        if (iVar3 < 0) {
          pIStack_18 = local_28;
        }
      }
    }
  }
  this->current_ = pIStack_18;
  return;
}

Assistant:

void MergingIterator::FindSmallest() {
  IteratorWrapper* smallest = nullptr;
  for (int i = 0; i < n_; i++) {
    IteratorWrapper* child = &children_[i];
    if (child->Valid()) {
      if (smallest == nullptr) {
        smallest = child;
      } else if (comparator_->Compare(child->key(), smallest->key()) < 0) {
        smallest = child;
      }
    }
  }
  current_ = smallest;
}